

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O2

Slice __thiscall arangodb::velocypack::ObjectIterator::key(ObjectIterator *this,bool translate)

{
  Slice SVar1;
  Exception *this_00;
  Slice s;
  
  if (this->_position == this->_size) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,IndexOutOfBounds);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  s._start = this->_current;
  if (s._start != (uint8_t *)0x0) {
    if (translate) {
      s = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s);
    }
    return (Slice)s._start;
  }
  SVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthKey
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this,
                     this->_position,translate);
  return (Slice)SVar1._start;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }